

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkHaigRecreateAig(Abc_Ntk_t *pNtk,Hop_Man_t *p)

{
  Abc_Aig_t *pMan;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Hop_Obj_t *pHVar4;
  void *pvVar5;
  Abc_Obj_t *pAVar6;
  long *plVar7;
  int local_4c;
  int i;
  Hop_Obj_t *pObj;
  Abc_Obj_t *pObjAbcRepr;
  Abc_Obj_t *pObjAbcThis;
  Abc_Obj_t *pObjOld;
  Abc_Ntk_t *pNtkAig;
  Hop_Man_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = p->nCreated;
  iVar1 = Vec_PtrSize(p->vObjs);
  if (iVar2 != iVar1) {
    __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                  ,0x15e,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
  }
  pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pAVar3 = Abc_AigConst1(pNtk_local);
  pHVar4 = Hop_ManConst1(p);
  (pHVar4->field_1).pNext = (Hop_Obj_t *)pAVar3;
  for (local_4c = 0; iVar2 = Vec_PtrSize(p->vPis), local_4c < iVar2; local_4c = local_4c + 1) {
    pvVar5 = Vec_PtrEntry(p->vPis,local_4c);
    pAVar3 = Abc_NtkCi(pNtk_local,local_4c);
    *(Abc_Obj_t **)((long)pvVar5 + 8) = pAVar3;
  }
  for (local_4c = 0; iVar2 = Vec_PtrSize(p->vObjs), local_4c < iVar2; local_4c = local_4c + 1) {
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,local_4c);
    iVar2 = Hop_ObjIsNode(pHVar4);
    if (iVar2 != 0) {
      pMan = (Abc_Aig_t *)pNtk_local->pManFunc;
      pAVar3 = Hop_ObjChild0Next(pHVar4);
      pAVar6 = Hop_ObjChild1Next(pHVar4);
      pAVar3 = Abc_AigAnd(pMan,pAVar3,pAVar6);
      (pHVar4->field_1).pNext = (Hop_Obj_t *)pAVar3;
      iVar2 = Hop_IsComplement((pHVar4->field_1).pNext);
      if (iVar2 != 0) {
        __assert_fail("!Hop_IsComplement(pObj->pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x16e,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
    }
  }
  for (local_4c = 0; iVar2 = Abc_NtkCoNum(pNtk), local_4c < iVar2; local_4c = local_4c + 1) {
    pAVar3 = Abc_NtkCo(pNtk,local_4c);
    pAVar3 = (pAVar3->field_6).pCopy;
    pHVar4 = Hop_ManPo(p,local_4c);
    pAVar6 = Hop_ObjChild0Next(pHVar4);
    Abc_ObjAddFanin(pAVar3,pAVar6);
  }
  local_4c = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= local_4c) {
      iVar2 = Abc_NtkCheck(pNtk_local);
      if (iVar2 == 0) {
        printf("Abc_NtkHaigUse: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      return pNtk_local;
    }
    plVar7 = (long *)Vec_PtrEntry(p->vObjs,local_4c);
    if (((*plVar7 != 0) && ((long *)*plVar7 != plVar7)) &&
       (iVar2 = Hop_ObjIsNode((Hop_Obj_t *)*plVar7), iVar2 != 0)) {
      pAVar3 = (Abc_Obj_t *)plVar7[1];
      pObj = *(Hop_Obj_t **)(*plVar7 + 8);
      if ((pAVar3->field_5).pData != (void *)0x0) {
        __assert_fail("pObjAbcThis->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x185,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
      iVar2 = Abc_ObjFanoutNum(pAVar3);
      if (iVar2 != 0) {
        __assert_fail("Abc_ObjFanoutNum(pObjAbcThis) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x187,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
      if ((Abc_Obj_t *)pObj == pAVar3) {
        __assert_fail("pObjAbcRepr != pObjAbcThis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x189,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
      iVar2 = Abc_NtkHaigCheckTfi(pNtk_local,(Abc_Obj_t *)pObj,pAVar3);
      if (iVar2 == 0) {
        for (; pObj[1].pFanin0 != (Hop_Obj_t *)0x0; pObj = pObj[1].pFanin0) {
        }
        pObj[1].pFanin0 = (Hop_Obj_t *)pAVar3;
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkHaigRecreateAig( Abc_Ntk_t * pNtk, Hop_Man_t * p )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObjOld, * pObjAbcThis, * pObjAbcRepr;
    Hop_Obj_t * pObj;
    int i;
    assert( p->nCreated == Vec_PtrSize(p->vObjs) );

    // start the new network
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );

    // transfer new nodes to the PIs of HOP
    Hop_ManConst1(p)->pNext = (Hop_Obj_t *)Abc_AigConst1( pNtkAig );
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = (Hop_Obj_t *)Abc_NtkCi( pNtkAig, i );

    // construct new nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = (Hop_Obj_t *)Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Hop_IsComplement(pObj->pNext) );
    }

    // set the COs
    Abc_NtkForEachCo( pNtk, pObjOld, i )
        Abc_ObjAddFanin( pObjOld->pCopy, Hop_ObjChild0Next(Hop_ManPo(p,i)) );

    // construct choice nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // skip the node without choices
        if ( pObj->pData == NULL )
            continue;
        // skip the representative of the class
        if ( pObj->pData == pObj )
            continue;
        // do not create choices for constant 1 and PIs
        if ( !Hop_ObjIsNode((Hop_Obj_t *)pObj->pData) )
            continue;
        // get the corresponding new nodes
        pObjAbcThis = (Abc_Obj_t *)pObj->pNext;
        pObjAbcRepr = (Abc_Obj_t *)((Hop_Obj_t *)pObj->pData)->pNext;
        // the new node cannot be already in the class
        assert( pObjAbcThis->pData == NULL );
        // the new node cannot have fanouts
        assert( Abc_ObjFanoutNum(pObjAbcThis) == 0 );
        // these should be different nodes
        assert( pObjAbcRepr != pObjAbcThis );
        // do not create choices if there is a path from pObjAbcThis to pObjAbcRepr
        if ( !Abc_NtkHaigCheckTfi( pNtkAig, pObjAbcRepr, pObjAbcThis ) )
        {
            // find the last node in the class
            while ( pObjAbcRepr->pData )
                pObjAbcRepr = (Abc_Obj_t *)pObjAbcRepr->pData;
            // add the new node at the end of the list
            pObjAbcRepr->pData = pObjAbcThis;
        }
    }

    // finish the new network
//    Abc_NtkFinalize( pNtk, pNtkAig );
//    Abc_AigCleanup( pNtkAig->pManFunc );
    // check correctness of the network
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkHaigUse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}